

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O3

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  uint uVar4;
  pointer pMVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  uint y;
  int iVar20;
  int iVar21;
  Mat *this_00;
  float *pfVar22;
  int x;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Mat m;
  float local_2c8;
  int iStack_2c4;
  void *local_2b0;
  Mat local_298;
  GridSample *local_250;
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  float fStack_230;
  float fStack_22c;
  ulong local_220;
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  ulong local_1d8;
  Mat *local_1d0;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 local_128;
  ulong local_110;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  Allocator *local_b8;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = pMVar5->w;
  uVar3 = pMVar5->h;
  uVar12 = pMVar5->c;
  uVar10 = (ulong)uVar12;
  local_250 = this;
  local_1d0 = this_00;
  if (pMVar5->dims == 4) {
    iVar13 = pMVar5->d;
    iVar14 = pMVar5[1].d;
    uVar4 = pMVar5[1].c;
    local_220 = CONCAT44(local_220._4_4_,pMVar5[1].h);
    Mat::create(this_00,pMVar5[1].h,iVar14,uVar4,uVar12,pMVar5->elemsize,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar16 = local_250->sample_type;
    if (iVar16 == 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      local_e8 = CONCAT44(local_e8._4_4_,(float)(uVar3 + -1));
      fStack_100 = (float)(int)uVar3;
      fStack_fc = (float)(int)uVar3;
      local_108 = (void *)CONCAT44((float)(int)uVar3,(float)(int)uVar3 * 0.5);
      local_f8 = (float)(uVar1 + -1);
      fStack_f4 = (float)(iVar13 + -1);
      fStack_f0 = -1.0;
      fStack_ec = -1.0;
      fStack_90 = 0.0;
      fStack_8c = 0.0;
      local_98 = CONCAT44((float)iVar13 * 0.5,(float)(int)uVar1 * 0.5);
      local_110 = CONCAT44(local_110._4_4_,pMVar5->elempack);
      local_b8 = pMVar5->allocator;
      local_38 = (long)pMVar5->w;
      local_40 = (long)pMVar5->h;
      local_ac = pMVar5->d;
      local_48 = pMVar5->data;
      local_50 = pMVar5->elemsize;
      local_58 = pMVar5->cstep * local_50;
      local_70 = local_40 * local_38;
      uVar17 = 0;
      local_60 = (local_50 * local_70 + 0xf & 0xfffffffffffffff0) / local_50;
      local_68 = (ulong)(uint)pMVar5->dims;
      local_b0 = pMVar5->dims - 1;
      do {
        local_298.data = (void *)(local_58 * uVar17 + (long)local_48);
        local_298.refcount = (int *)0x0;
        local_298.elemsize = local_50;
        local_298.elempack = (int)local_110;
        local_298.allocator = local_b8;
        local_298.w = (int)local_38;
        local_298.h = (int)local_40;
        local_298.d = 1;
        local_298.c = local_ac;
        local_298.cstep = local_60;
        local_298.dims = local_b0;
        if ((int)local_68 == 4) {
          local_298.cstep = local_70;
        }
        if (0 < (int)uVar4) {
          local_218 = (float *)(this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
          local_88 = pMVar5[1].data;
          sVar6 = pMVar5[1].cstep;
          sVar7 = pMVar5[1].elemsize;
          local_a8 = 0;
          local_d8 = uVar17;
          do {
            if (0 < iVar14) {
              local_188 = (float *)(sVar6 * sVar7 * local_a8 + (long)local_88);
              local_178 = CONCAT44(local_178._4_4_,local_250->padding_mode);
              iVar13 = local_250->align_corner;
              iVar16 = 0;
              local_c8 = (Allocator *)CONCAT44(local_c8._4_4_,iVar13);
              do {
                local_1d8 = CONCAT44(local_1d8._4_4_,iVar16);
                iVar16 = (int)local_220;
                if (0 < (int)local_220) {
                  do {
                    local_198 = (float *)CONCAT44(local_198._4_4_,iVar16);
                    if (iVar13 == 0) {
                      local_2c8 = (local_188[1] + 1.0) * (float)local_108 + -0.5;
                      local_248._0_4_ = (*local_188 + 1.0) * (float)local_98 + -0.5;
                      local_248._4_4_ = (local_188[2] + 1.0) * local_98._4_4_ + -0.5;
                      fStack_240 = fStack_90 * 0.0 + 0.0;
                      fStack_23c = fStack_8c * 0.0 + 0.0;
                    }
                    else {
                      local_2c8 = (local_188[1] * 0.5 + 0.5) * (float)local_e8;
                      local_248._0_4_ = (*local_188 * 0.5 + 0.5) * local_f8;
                      local_248._4_4_ = (local_188[2] * 0.5 + 0.5) * fStack_f4;
                      fStack_240 = fStack_f0 * 0.0;
                      fStack_23c = fStack_ec * 0.0;
                    }
                    fVar25 = floorf((float)local_248);
                    local_128 = CONCAT44(extraout_XMM0_Db_14,fVar25);
                    uVar12 = (uint)fVar25;
                    fVar25 = floorf(local_2c8);
                    local_138 = (Allocator *)CONCAT44(extraout_XMM0_Db_15,fVar25);
                    y = (uint)fVar25;
                    local_148 = (void *)CONCAT44(local_248._4_4_,local_248._4_4_);
                    fStack_140 = local_248._4_4_;
                    fStack_13c = local_248._4_4_;
                    fVar25 = floorf(local_248._4_4_);
                    local_1e8 = (void *)CONCAT44(extraout_XMM0_Db_16,fVar25);
                    iVar16 = (int)fVar25;
                    x = uVar12 + 1;
                    iVar21 = y + 1;
                    local_1c8 = (void *)CONCAT44(local_1c8._4_4_,iVar16 + 1);
                    iVar18 = (int)(float)local_178;
                    iVar13 = (int)(float)local_c8;
                    local_238 = (ulong)uVar12;
                    local_208 = (ulong)y;
                    fVar25 = get_value_bounded(&local_298,uVar12,y,iVar16,(int)(float)local_178,
                                               (int)(float)local_c8);
                    local_1a8 = CONCAT44(extraout_XMM0_Db_17,fVar25);
                    fVar25 = get_value_bounded(&local_298,x,y,iVar16,iVar18,iVar13);
                    local_158 = (void *)CONCAT44(extraout_XMM0_Db_18,fVar25);
                    iVar20 = (int)local_238;
                    fVar25 = get_value_bounded(&local_298,iVar20,iVar21,iVar16,iVar18,iVar13);
                    local_1f8 = CONCAT44(extraout_XMM0_Db_19,fVar25);
                    fVar25 = get_value_bounded(&local_298,x,iVar21,iVar16,iVar18,iVar13);
                    local_1b8 = CONCAT44(extraout_XMM0_Db_20,fVar25);
                    iVar8 = (int)local_208;
                    iVar16 = (int)(float)local_1c8;
                    fVar25 = get_value_bounded(&local_298,iVar20,iVar8,(int)(float)local_1c8,iVar18,
                                               iVar13);
                    local_168 = (Allocator *)CONCAT44(extraout_XMM0_Db_21,fVar25);
                    fVar25 = get_value_bounded(&local_298,x,iVar8,iVar16,iVar18,iVar13);
                    local_208 = CONCAT44(extraout_XMM0_Db_22,fVar25);
                    fVar25 = get_value_bounded(&local_298,(int)local_238,iVar21,iVar16,iVar18,iVar13
                                              );
                    local_238 = CONCAT44(extraout_XMM0_Db_23,fVar25);
                    fVar25 = get_value_bounded(&local_298,x,iVar21,iVar16,iVar18,iVar13);
                    local_248._0_4_ = (float)local_248 - (float)(int)(float)local_128;
                    local_2c8 = local_2c8 - (float)(int)(float)local_138;
                    fVar23 = 1.0 - (float)local_248;
                    fVar26 = local_2c8 *
                             ((float)local_1b8 * (float)local_248 + (float)local_1f8 * fVar23) +
                             (1.0 - local_2c8) *
                             ((float)local_1a8 * fVar23 + (float)local_158 * (float)local_248);
                    *local_218 = (((1.0 - local_2c8) *
                                   ((float)local_168 * fVar23 + (float)local_208 * (float)local_248)
                                  - fVar26) +
                                 local_2c8 * (fVar25 * (float)local_248 + (float)local_238 * fVar23)
                                 ) * ((float)local_148 - (float)(int)(float)local_1e8) + fVar26;
                    local_218 = local_218 + 1;
                    local_188 = local_188 + 3;
                    iVar16 = (int)(float)local_198 + -1;
                    uVar17 = local_d8;
                    this_00 = local_1d0;
                  } while (iVar16 != 0);
                }
                iVar16 = (int)local_1d8 + 1;
              } while (iVar16 != iVar14);
            }
            local_a8 = local_a8 + 1;
          } while (local_a8 != uVar4);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar10);
      return 0;
    }
    if (iVar16 != 2) {
      if (iVar16 != 3) {
        return 0;
      }
      forward();
      return -1;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    local_238 = CONCAT44(local_238._4_4_,(float)(uVar3 + -1));
    fStack_180 = (float)(int)uVar3;
    fStack_17c = (float)(int)uVar3;
    local_188 = (float *)CONCAT44((float)(int)uVar3,(float)(int)uVar3 * 0.5);
    fStack_210 = -1.0;
    fStack_20c = -1.0;
    local_218 = (float *)CONCAT44((float)(iVar13 + -1),(float)(uVar1 + -1));
    fStack_190 = 0.0;
    fStack_18c = 0.0;
    local_198 = (float *)CONCAT44((float)iVar13 * 0.5,(float)(int)uVar1 * 0.5);
    local_158 = (void *)CONCAT44(local_158._4_4_,pMVar5->elempack);
    local_168 = pMVar5->allocator;
    local_1f8 = (long)pMVar5->w;
    local_1b8 = (ulong)pMVar5->h;
    local_208 = CONCAT44(local_208._4_4_,pMVar5->d);
    local_1c8 = pMVar5->data;
    local_178 = pMVar5->elemsize;
    local_c8 = (Allocator *)(pMVar5->cstep * local_178);
    local_108 = (void *)(local_1b8 * local_1f8);
    local_1a8 = 0;
    local_d8 = (local_178 * (long)local_108 + 0xf & 0xfffffffffffffff0) / local_178;
    local_e8 = (ulong)(uint)pMVar5->dims;
    local_f8 = (float)(pMVar5->dims - 1);
    do {
      local_298.data = (void *)((long)local_c8 * local_1a8 + (long)local_1c8);
      local_298.refcount = (int *)0x0;
      local_298.elemsize = local_178;
      local_298.elempack = (int)(float)local_158;
      local_298.allocator = local_168;
      local_298.w = (int)local_1f8;
      local_298.h = (int)local_1b8;
      local_298.d = 1;
      local_298.c = (int)(float)local_208;
      local_298.cstep = local_d8;
      local_298.dims = (int)local_f8;
      if ((float)local_e8 == 5.60519e-45) {
        local_298.cstep = (size_t)local_108;
      }
      if (0 < (int)uVar4) {
        pfVar9 = (float *)(local_1d0->cstep * local_1a8 * local_1d0->elemsize +
                          (long)local_1d0->data);
        local_148 = pMVar5[1].data;
        local_1e8 = (void *)(pMVar5[1].cstep * pMVar5[1].elemsize);
        local_138 = (Allocator *)0x0;
        do {
          if (0 < iVar14) {
            pfVar22 = (float *)((long)local_1e8 * (long)local_138 + (long)local_148);
            iVar13 = local_250->padding_mode;
            iVar16 = local_250->align_corner;
            iVar18 = 0;
            do {
              local_128 = CONCAT44(local_128._4_4_,iVar18);
              iVar18 = (int)local_220;
              if (0 < (int)local_220) {
                do {
                  if (iVar16 == 0) {
                    fVar25 = (pfVar22[1] + 1.0) * (float)local_188 + -0.5;
                    local_248._0_4_ = (*pfVar22 + 1.0) * (float)local_198 + -0.5;
                    local_248._4_4_ = (pfVar22[2] + 1.0) * local_198._4_4_ + -0.5;
                    fStack_240 = fStack_190 * 0.0 + 0.0;
                    fStack_23c = fStack_18c * 0.0 + 0.0;
                  }
                  else {
                    fVar25 = (pfVar22[1] * 0.5 + 0.5) * (float)local_238;
                    local_248._0_4_ = (*pfVar22 * 0.5 + 0.5) * (float)local_218;
                    local_248._4_4_ = (pfVar22[2] * 0.5 + 0.5) * local_218._4_4_;
                    fStack_240 = fStack_210 * 0.0;
                    fStack_23c = fStack_20c * 0.0;
                  }
                  fVar23 = roundf((float)local_248);
                  fVar25 = roundf(fVar25);
                  fVar26 = roundf(local_248._4_4_);
                  fVar25 = get_value_bounded(&local_298,(int)fVar23,(int)fVar25,(int)fVar26,iVar13,
                                             iVar16);
                  *pfVar9 = fVar25;
                  pfVar9 = pfVar9 + 1;
                  pfVar22 = pfVar22 + 3;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              iVar18 = (int)(float)local_128 + 1;
            } while (iVar18 != iVar14);
          }
          local_138 = (Allocator *)((long)local_138 + 1);
        } while (local_138 != (Allocator *)(ulong)uVar4);
      }
      local_1a8 = local_1a8 + 1;
    } while (local_1a8 != uVar10);
    return 0;
  }
  if (pMVar5->dims == 3) {
    iVar13 = pMVar5[1].h;
    uVar4 = pMVar5[1].c;
    uVar17 = (ulong)uVar4;
    Mat::create(this_00,iVar13,uVar4,uVar12,pMVar5->elemsize,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar14 = local_250->sample_type;
    if (iVar14 == 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      uStack_1f0 = 0;
      uStack_1ec = 0;
      local_1f8 = CONCAT44((float)(int)uVar3 * 0.5,(float)(int)uVar1 * 0.5);
      uStack_160 = 0xbf800000;
      uStack_15c = 0xbf800000;
      local_168 = (Allocator *)CONCAT44((float)(uVar3 + -1),(float)(uVar1 + -1));
      local_178 = CONCAT44(local_178._4_4_,pMVar5->elempack);
      local_c8 = pMVar5->allocator;
      local_d8 = (ulong)pMVar5->w;
      local_e8 = (ulong)pMVar5->h;
      local_f8 = (float)pMVar5->d;
      local_108 = pMVar5->data;
      local_98 = pMVar5->elemsize;
      lVar11 = pMVar5->cstep * local_98;
      local_a8 = local_e8 * local_d8;
      local_1c8 = (void *)0x0;
      local_220 = (local_98 * local_a8 + 0xf & 0xfffffffffffffff0) / local_98;
      uVar12 = pMVar5->dims;
      local_1d8 = (ulong)uVar12;
      do {
        local_298.data = (void *)(lVar11 * (long)local_1c8 + (long)local_108);
        local_298.refcount = (int *)0x0;
        local_298.elemsize = local_98;
        local_298.elempack = (int)(float)local_178;
        local_298.allocator = local_c8;
        local_298.w = (int)local_d8;
        local_298.h = (int)local_e8;
        local_298.d = 1;
        local_298.c = (int)local_f8;
        local_298.cstep = local_220;
        if ((int)local_1d8 == 4) {
          local_298.cstep = local_a8;
        }
        if (0 < (int)uVar4) {
          local_248 = (float *)(this_00->cstep * (long)local_1c8 * this_00->elemsize +
                               (long)this_00->data);
          local_208 = pMVar5[1].cstep * pMVar5[1].elemsize;
          local_1e8 = pMVar5[1].data;
          local_1a8 = CONCAT44(local_1a8._4_4_,local_250->padding_mode);
          iVar14 = local_250->align_corner;
          local_1b8 = 0;
          local_158 = (void *)CONCAT44(local_158._4_4_,iVar14);
          local_298.dims = uVar12 - 1;
          do {
            if (0 < iVar13) {
              local_238 = 0;
              do {
                uVar2 = *(undefined8 *)((long)local_1e8 + local_238 * 8);
                fVar23 = (float)uVar2;
                fVar25 = (float)((ulong)uVar2 >> 0x20);
                if (iVar14 == 0) {
                  fVar23 = (fVar23 + 1.0) * (float)local_1f8 + -0.5;
                  fVar25 = (fVar25 + 1.0) * local_1f8._4_4_ + -0.5;
                }
                else {
                  fVar23 = (fVar23 * 0.5 + 0.5) * (float)local_168;
                  fVar25 = (fVar25 * 0.5 + 0.5) * local_168._4_4_;
                }
                fVar26 = floorf(fVar23);
                local_218 = (float *)CONCAT44(extraout_XMM0_Db_24,fVar26);
                iVar18 = (int)fVar26;
                local_188 = (float *)CONCAT44(fVar25,fVar25);
                fStack_180 = fVar25;
                fStack_17c = fVar25;
                fVar25 = floorf(fVar25);
                local_128 = CONCAT44(extraout_XMM0_Db_25,fVar25);
                iVar21 = (int)fVar25;
                iVar16 = (int)(float)local_1a8;
                iVar14 = (int)(float)local_158;
                fVar25 = get_value_bounded(&local_298,iVar18,iVar21,(int)(float)local_1a8,
                                           (int)(float)local_158);
                local_198 = (float *)CONCAT44(extraout_XMM0_Db_26,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar18 + 1,iVar21,iVar16,iVar14);
                local_138 = (Allocator *)CONCAT44(extraout_XMM0_Db_27,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar18,iVar21 + 1,iVar16,iVar14);
                local_148 = (void *)CONCAT44(extraout_XMM0_Db_28,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar18 + 1,iVar21 + 1,iVar16,iVar14);
                fVar23 = fVar23 - (float)(int)(float)local_218;
                fVar26 = (float)local_198 * (1.0 - fVar23) + fVar23 * (float)local_138;
                *local_248 = ((fVar25 * fVar23 + (1.0 - fVar23) * (float)local_148) - fVar26) *
                             ((float)local_188 - (float)(int)(float)local_128) + fVar26;
                local_248 = local_248 + 1;
                local_238 = local_238 + 1;
                this_00 = local_1d0;
              } while (iVar13 != (int)local_238);
            }
            local_1b8 = local_1b8 + 1;
            local_1e8 = (void *)((long)local_1e8 + local_208);
          } while (local_1b8 != uVar17);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != (void *)uVar10);
      return 0;
    }
    if (iVar14 == 2) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      fStack_240 = -1.0;
      fStack_23c = -1.0;
      local_248 = (float *)CONCAT44((float)(uVar3 + -1),(float)(uVar1 + -1));
      fStack_230 = 0.0;
      fStack_22c = 0.0;
      local_238 = CONCAT44((float)(int)uVar3 * 0.5,(float)(int)uVar1 * 0.5);
      local_128 = CONCAT44(local_128._4_4_,pMVar5->elempack);
      local_138 = pMVar5->allocator;
      local_148 = (void *)(long)pMVar5->w;
      local_1e8 = (void *)(long)pMVar5->h;
      local_1a8 = CONCAT44(local_1a8._4_4_,pMVar5->d);
      local_158 = pMVar5->data;
      local_168 = (Allocator *)pMVar5->elemsize;
      local_1f8 = pMVar5->cstep * (long)local_168;
      local_178 = (long)local_1e8 * (long)local_148;
      local_198 = (float *)0x0;
      local_1b8 = ((long)local_168 * local_178 + 0xf & 0xfffffffffffffff0) / (ulong)local_168;
      local_208 = (ulong)(uint)pMVar5->dims;
      local_1c8 = (void *)CONCAT44(local_1c8._4_4_,pMVar5->dims - 1);
      do {
        local_298.data = (void *)(local_1f8 * (long)local_198 + (long)local_158);
        local_298.refcount = (int *)0x0;
        local_298.elemsize = (size_t)local_168;
        local_298.elempack = (int)(float)local_128;
        local_298.allocator = local_138;
        local_298.w = (int)local_148;
        local_298.h = (int)local_1e8;
        local_298.d = 1;
        local_298.c = (int)(float)local_1a8;
        local_298.cstep = local_1b8;
        local_298.dims = (int)(float)local_1c8;
        if ((float)local_208 == 5.60519e-45) {
          local_298.cstep = local_178;
        }
        if (0 < (int)uVar4) {
          pfVar9 = (float *)(local_1d0->cstep * (long)local_198 * local_1d0->elemsize +
                            (long)local_1d0->data);
          local_188 = (float *)(pMVar5[1].cstep * pMVar5[1].elemsize);
          pvVar19 = pMVar5[1].data;
          iVar14 = local_250->padding_mode;
          iVar16 = local_250->align_corner;
          local_218 = (float *)0x0;
          do {
            if (0 < iVar13) {
              lVar11 = 0;
              do {
                uVar2 = *(undefined8 *)((long)pvVar19 + lVar11 * 8);
                fVar23 = (float)uVar2;
                fVar25 = (float)((ulong)uVar2 >> 0x20);
                if (iVar16 == 0) {
                  fVar23 = (fVar23 + 1.0) * (float)local_238 + -0.5;
                  fVar25 = (fVar25 + 1.0) * local_238._4_4_ + -0.5;
                }
                else {
                  fVar23 = (fVar23 * 0.5 + 0.5) * (float)local_248;
                  fVar25 = (fVar25 * 0.5 + 0.5) * local_248._4_4_;
                }
                fVar23 = roundf(fVar23);
                fVar25 = roundf(fVar25);
                fVar25 = get_value_bounded(&local_298,(int)fVar23,(int)fVar25,iVar14,iVar16);
                *pfVar9 = fVar25;
                pfVar9 = pfVar9 + 1;
                lVar11 = lVar11 + 1;
              } while (iVar13 != (int)lVar11);
            }
            local_218 = (float *)((long)local_218 + 1);
            pvVar19 = (void *)((long)pvVar19 + (long)local_188);
          } while (local_218 != (float *)uVar17);
        }
        local_198 = (float *)((long)local_198 + 1);
      } while (local_198 != (float *)uVar10);
      return 0;
    }
    if (iVar14 == 3) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      fStack_a0 = -1.0;
      fStack_9c = -1.0;
      local_a8 = CONCAT44((float)(uVar3 + -1),(float)(uVar1 + -1));
      fStack_80 = 0.0;
      fStack_7c = 0.0;
      local_88 = (void *)CONCAT44((float)(int)uVar3 * 0.5,(float)(int)uVar1 * 0.5);
      uVar15 = 0;
      do {
        local_298.w = pMVar5->w;
        local_298.h = pMVar5->h;
        local_298.c = pMVar5->d;
        local_298.elemsize = pMVar5->elemsize;
        local_298.data = (void *)(pMVar5->cstep * uVar15 * local_298.elemsize + (long)pMVar5->data);
        local_298.elempack = pMVar5->elempack;
        local_298.allocator = pMVar5->allocator;
        local_298.refcount = (int *)0x0;
        local_298.d = 1;
        local_298.dims = pMVar5->dims + -1;
        local_298.cstep =
             (local_298.elemsize * (long)local_298.h * (long)local_298.w + 0xf & 0xfffffffffffffff0)
             / local_298.elemsize;
        if (pMVar5->dims == 4) {
          local_298.cstep = (long)local_298.h * (long)local_298.w;
        }
        if (0 < (int)uVar4) {
          pfVar9 = (float *)(this_00->cstep * uVar15 * this_00->elemsize + (long)this_00->data);
          local_b8 = (Allocator *)(pMVar5[1].cstep * pMVar5[1].elemsize);
          local_2b0 = pMVar5[1].data;
          local_1d8 = CONCAT44(local_1d8._4_4_,local_250->padding_mode);
          iVar14 = local_250->align_corner;
          local_110 = 0;
          local_220 = uVar15;
          do {
            if (0 < iVar13) {
              lVar11 = 0;
              do {
                uVar2 = *(undefined8 *)((long)local_2b0 + lVar11 * 8);
                fVar23 = (float)uVar2;
                fVar25 = (float)((ulong)uVar2 >> 0x20);
                if (iVar14 == 0) {
                  fVar23 = (fVar23 + 1.0) * (float)local_88 + -0.5;
                  fVar25 = (fVar25 + 1.0) * local_88._4_4_ + -0.5;
                  fStack_230 = fStack_80 * 0.0 + 0.0;
                  fStack_22c = fStack_7c * 0.0 + 0.0;
                }
                else {
                  fVar23 = (fVar23 * 0.5 + 0.5) * (float)local_a8;
                  fVar25 = (fVar25 * 0.5 + 0.5) * local_a8._4_4_;
                  fStack_230 = fStack_a0 * 0.0;
                  fStack_22c = fStack_9c * 0.0;
                }
                local_238 = CONCAT44(fVar25,fVar23);
                local_198 = pfVar9;
                local_128 = lVar11;
                fVar25 = floorf(fVar23);
                local_d8 = CONCAT44(extraout_XMM0_Db,fVar25);
                uVar12 = (uint)fVar25;
                local_1c8 = (void *)CONCAT44(local_238._4_4_,local_238._4_4_);
                fStack_1c0 = local_238._4_4_;
                fStack_1bc = local_238._4_4_;
                fVar25 = floorf(local_238._4_4_);
                local_178 = CONCAT44(extraout_XMM0_Db_00,fVar25);
                iVar18 = (int)fVar25;
                iVar16 = iVar18 + -1;
                iVar8 = uVar12 + 1;
                local_1f8 = CONCAT44(local_1f8._4_4_,iVar18 + 1);
                local_188 = (float *)CONCAT44(local_188._4_4_,uVar12 + 2);
                local_f8 = (float)(iVar18 + 2);
                iVar21 = (int)local_1d8;
                local_248 = (float *)(ulong)uVar12;
                local_218._0_4_ = (float)(uVar12 - 1);
                fVar25 = get_value_bounded(&local_298,uVar12 - 1,iVar16,(int)local_1d8,iVar14);
                local_1e8 = (void *)CONCAT44(extraout_XMM0_Db_01,fVar25);
                fVar25 = get_value_bounded(&local_298,uVar12,iVar16,iVar21,iVar14);
                local_148 = (void *)CONCAT44(extraout_XMM0_Db_02,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar8,iVar16,iVar21,iVar14);
                local_c8 = (Allocator *)CONCAT44(extraout_XMM0_Db_03,fVar25);
                fVar25 = get_value_bounded(&local_298,(int)(float)local_188,iVar16,iVar21,iVar14);
                local_138 = (Allocator *)CONCAT44(extraout_XMM0_Db_04,fVar25);
                fVar25 = get_value_bounded(&local_298,(int)(float)local_218,iVar18,iVar21,iVar14);
                local_1a8 = CONCAT44(extraout_XMM0_Db_05,fVar25);
                fVar25 = get_value_bounded(&local_298,(int)local_248,iVar18,iVar21,iVar14);
                local_168 = (Allocator *)CONCAT44(extraout_XMM0_Db_06,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar8,iVar18,iVar21,iVar14);
                local_e8 = CONCAT44(extraout_XMM0_Db_07,fVar25);
                iVar20 = (int)(float)local_188;
                fVar25 = get_value_bounded(&local_298,(int)(float)local_188,iVar18,iVar21,iVar14);
                iVar16 = (int)(float)local_218;
                local_158 = (void *)CONCAT44(extraout_XMM0_Db_08,fVar25);
                iVar18 = (int)(float)local_1f8;
                fVar25 = get_value_bounded(&local_298,(int)(float)local_218,(int)(float)local_1f8,
                                           iVar21,iVar14);
                local_208 = CONCAT44(extraout_XMM0_Db_09,fVar25);
                fVar25 = get_value_bounded(&local_298,(int)local_248,iVar18,iVar21,iVar14);
                local_1b8 = CONCAT44(extraout_XMM0_Db_10,fVar25);
                fVar25 = get_value_bounded(&local_298,iVar8,iVar18,iVar21,iVar14);
                local_108 = (void *)CONCAT44(extraout_XMM0_Db_11,fVar25);
                fVar23 = get_value_bounded(&local_298,iVar20,iVar18,iVar21,iVar14);
                fVar25 = local_f8;
                local_1f8 = CONCAT44(extraout_XMM0_Db_12,fVar23);
                fVar23 = get_value_bounded(&local_298,iVar16,(int)local_f8,iVar21,iVar14);
                local_218 = (float *)CONCAT44(local_218._4_4_,fVar23);
                fVar23 = get_value_bounded(&local_298,(int)local_248,(int)fVar25,iVar21,iVar14);
                local_248 = (float *)CONCAT44(local_248._4_4_,fVar23);
                fVar23 = get_value_bounded(&local_298,iVar8,(int)fVar25,iVar21,iVar14);
                local_98 = CONCAT44(extraout_XMM0_Db_13,fVar23);
                fVar25 = get_value_bounded(&local_298,iVar20,(int)fVar25,iVar21,iVar14);
                fVar23 = (float)local_238 - (float)(int)(float)local_d8;
                fVar28 = fVar23 + 1.0;
                fVar26 = 1.0 - fVar23;
                fVar27 = (fVar26 * 1.25 + -2.25) * fVar26 * fVar26;
                fVar26 = (float)local_1c8 - (float)(int)(float)local_178;
                fVar30 = fVar26 + 1.0;
                fVar24 = fVar27 + 1.0;
                fVar28 = (3.0 - fVar28 * 6.0) + (3.75 - fVar28 * 0.75) * fVar28 * fVar28;
                fVar29 = (fVar23 * 1.25 + -2.25) * fVar23 * fVar23 + 1.0;
                fVar31 = 1.0 - fVar26;
                fVar23 = (3.0 - fVar30 * 6.0) + (3.75 - fVar30 * 0.75) * fVar30 * fVar30;
                fVar26 = (fVar26 * 1.25 + -2.25) * fVar26 * fVar26 + 1.0;
                fVar30 = (fVar31 * 1.25 + -2.25) * fVar31 * fVar31;
                fVar27 = fVar28 + fVar27 + fVar29;
                *local_198 = (fVar23 + fVar26 + fVar30) *
                             (fVar25 * fVar27 -
                             (fVar29 * (float)local_248 + fVar28 * (float)local_218 +
                             (float)local_98 * fVar24)) +
                             fVar26 * ((fVar24 * (float)local_e8 +
                                       (float)local_1a8 * fVar28 + (float)local_168 * fVar29) -
                                      (float)local_158 * fVar27) +
                             (fVar30 + 1.0) *
                             ((fVar24 * (float)local_108 +
                              (float)local_1b8 * fVar29 + (float)local_208 * fVar28) -
                             (float)local_1f8 * fVar27) +
                             fVar23 * (((float)local_c8 * fVar24 +
                                       (float)local_148 * fVar29 + (float)local_1e8 * fVar28) -
                                      (float)local_138 * fVar27);
                pfVar9 = local_198 + 1;
                lVar11 = local_128 + 1;
                uVar15 = local_220;
              } while (iVar13 != (int)lVar11);
            }
            this_00 = local_1d0;
            local_110 = local_110 + 1;
            local_2b0 = (void *)((long)local_2b0 + (long)local_b8);
          } while (local_110 != uVar17);
          if (local_298.refcount != (int *)0x0) {
            LOCK();
            *local_298.refcount = *local_298.refcount + -1;
            UNLOCK();
            if (*local_298.refcount == 0) {
              if (local_298.allocator == (Allocator *)0x0) {
                if (local_298.data != (void *)0x0) {
                  free(local_298.data);
                }
              }
              else {
                (*(local_298.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar10);
      return 0;
    }
  }
  return 0;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = grid.h;
        int outh = grid.c;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bilinear interpolate
                        float v;
                        {
                            int x0 = (int)floor(sample_x);
                            int y0 = (int)floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        int x0 = static_cast<int>(round(sample_x));
                        int y0 = static_cast<int>(round(sample_y));

                        float v = get_value_bounded(image, x0, y0, padding_mode, align_corner);

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
        else if (sample_type == 3) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int y = 0; y < outh; y++)
                {
                    const float* gridptr = grid.channel(y);

                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        gridptr += 2;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = grid.h;
        int outh = grid.d;
        int outd = grid.c;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == 1) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);
                                float v001 = get_value_bounded(image, x1, y0, z0, padding_mode, align_corner);
                                float v010 = get_value_bounded(image, x0, y1, z0, padding_mode, align_corner);
                                float v011 = get_value_bounded(image, x1, y1, z0, padding_mode, align_corner);
                                float v100 = get_value_bounded(image, x0, y0, z1, padding_mode, align_corner);
                                float v101 = get_value_bounded(image, x1, y0, z1, padding_mode, align_corner);
                                float v110 = get_value_bounded(image, x0, y1, z1, padding_mode, align_corner);
                                float v111 = get_value_bounded(image, x1, y1, z1, padding_mode, align_corner);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 2) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    const float* gridptr = grid.channel(z);

                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = gridptr[0];
                            float sample_y = gridptr[1];
                            float sample_z = gridptr[2];

                            sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                            sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                            sample_z = grid_sample_unormalize(d, sample_z, align_corner);

                            int x0 = static_cast<int>(round(sample_x));
                            int y0 = static_cast<int>(round(sample_y));
                            int z0 = static_cast<int>(round(sample_z));

                            float v = get_value_bounded(image, x0, y0, z0, padding_mode, align_corner);

                            outptr[0] = v;
                            outptr += 1;

                            gridptr += 3;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}